

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

bool QObject::disconnectImpl
               (QObject *sender,void **signal,QObject *receiver,void **slot,
               QMetaObject *senderMetaObject)

{
  QMetaObject *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  int signal_index;
  int local_4c;
  int *local_48;
  void **ppvStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sender == (QObject *)0x0) || (slot != (void **)0x0 && receiver == (QObject *)0x0)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      disconnectImpl();
    }
LAB_002bcb06:
    bVar3 = false;
  }
  else {
    local_4c = -1;
    if (signal != (void **)0x0) {
      local_48 = &local_4c;
      bVar3 = senderMetaObject != (QMetaObject *)0x0;
      ppvStack_40 = signal;
      if (bVar3) {
        while ((QMetaObject::static_metacall(senderMetaObject,IndexOfMethod,0,&local_48),
               local_4c < 0 || ((int)(senderMetaObject->d).data[0xd] <= local_4c))) {
          senderMetaObject = (senderMetaObject->d).superdata.direct;
          bVar3 = senderMetaObject != (QMetaObject *)0x0;
          if ((senderMetaObject == (QMetaObject *)0x0) || (-1 < local_4c)) break;
        }
      }
      if (bVar3) {
        iVar2 = 0;
        for (pQVar1 = (senderMetaObject->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
            pQVar1 = (pQVar1->d).superdata.direct) {
          iVar2 = iVar2 + (pQVar1->d).data[0xd];
        }
        local_4c = local_4c + iVar2;
      }
      else {
        lcConnect();
        if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)
        {
          disconnectImpl(sender);
        }
      }
      if (!bVar3) goto LAB_002bcb06;
    }
    bVar3 = QMetaObjectPrivate::disconnect
                      (sender,local_4c,senderMetaObject,receiver,-1,slot,DisconnectAll);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QObject::disconnectImpl(const QObject *sender, void **signal, const QObject *receiver, void **slot, const QMetaObject *senderMetaObject)
{
    if (sender == nullptr || (receiver == nullptr && slot != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }

    int signal_index = -1;
    if (signal) {
        void *args[] = { &signal_index, signal };
        for (; senderMetaObject && signal_index < 0; senderMetaObject = senderMetaObject->superClass()) {
            senderMetaObject->static_metacall(QMetaObject::IndexOfMethod, 0, args);
            if (signal_index >= 0 && signal_index < QMetaObjectPrivate::get(senderMetaObject)->signalCount)
                break;
        }
        if (!senderMetaObject) {
            qCWarning(lcConnect, "QObject::disconnect: signal not found in %s", sender->metaObject()->className());
            return false;
        }
        signal_index += QMetaObjectPrivate::signalOffset(senderMetaObject);
    }

    return QMetaObjectPrivate::disconnect(sender, signal_index, senderMetaObject, receiver, -1, slot);
}